

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

bool ON_BrepRemoveSlits(ON_BrepFace *F)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  TYPE TVar4;
  int *piVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  TYPE TVar9;
  ON_BrepLoop *pOVar10;
  ON_Brep *pOVar11;
  ON_BrepEdge *pOVar12;
  ON_BrepLoop *pOVar13;
  ON_Surface *pOVar14;
  double *pdVar15;
  ON_SimpleArray<int> *pOVar16;
  int iVar17;
  uint uVar18;
  uint *puVar19;
  ulong uVar20;
  long lVar21;
  ON_BrepTrim *pOVar22;
  size_t sVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  ON_BrepTrim *pOVar27;
  _func_int **extraout_XMM0_Qa;
  bool *in_XMM1_Qa;
  ON_SimpleArray<bool> bUsed;
  ON_ClassArray<ON_SimpleArray<int>_> NewLoops;
  ON_2dPoint AP;
  ON_SimpleArray<int> slits;
  ON_SimpleArray<bool> bIsSlit;
  int local_144;
  ON_Brep *local_140;
  undefined1 local_138 [24];
  ulong local_120;
  ON_BrepLoop *local_118;
  uint local_10c;
  ON_ClassArray<ON_SimpleArray<int>_> local_108;
  double local_f0;
  ON_2dPoint local_e8;
  double local_d8;
  undefined8 uStack_d0;
  long local_c8;
  ON_SimpleArray<int> local_c0;
  double local_a8;
  undefined8 uStack_a0;
  ON_BrepFace *local_98;
  _func_int **local_90;
  _func_int **local_88;
  ON_BrepFace *local_80;
  ulong local_78;
  long local_70;
  ON_BrepTrim *local_68;
  ON_SimpleArray<bool> local_60;
  _func_int **local_48;
  long local_40;
  ON_Brep *local_38;
  
  if (((F->m_face_index < 0) || (local_38 = ON_BrepFace::Brep(F), local_38 == (ON_Brep *)0x0)) ||
     (local_40 = (long)(F->m_li).m_count, local_40 < 1)) {
    return false;
  }
  local_88 = (_func_int **)&PTR__ON_SimpleArray_00809cc8;
  local_90 = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
  local_48 = (_func_int **)&PTR__ON_ClassArray_0080d848;
  local_c8 = 0;
  bVar7 = false;
  local_98 = F;
LAB_0041721b:
  iVar24 = (F->m_li).m_a[local_c8];
  pOVar10 = (local_38->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
  if (-1 < pOVar10[iVar24].m_loop_index) {
    pOVar10 = pOVar10 + iVar24;
    local_80 = ON_BrepLoop::Face(pOVar10);
    if ((local_80 == (ON_BrepFace *)0x0) ||
       (local_140 = ON_BrepLoop::Brep(pOVar10), local_140 == (ON_Brep *)0x0)) goto LAB_00417749;
    sVar23 = (size_t)(pOVar10->m_ti).m_count;
    local_60._vptr_ON_SimpleArray = local_88;
    local_60.m_a = (bool *)0x0;
    local_60.m_count = 0;
    local_60.m_capacity = 0;
    local_118 = pOVar10;
    if (sVar23 == 0) {
      local_c0._vptr_ON_SimpleArray = local_90;
      local_c0.m_a = (int *)0x0;
      local_c0.m_count = 0;
      local_c0.m_capacity = 0;
    }
    else {
      ON_SimpleArray<bool>::SetCapacity(&local_60,sVar23);
      sVar23 = (size_t)(pOVar10->m_ti).m_count;
      local_c0._vptr_ON_SimpleArray = local_90;
      local_c0.m_a = (int *)0x0;
      local_c0.m_count = 0;
      local_c0.m_capacity = 0;
      if (sVar23 != 0) {
        ON_SimpleArray<int>::SetCapacity(&local_c0,sVar23);
        uVar18 = (local_118->m_ti).m_count;
        if (0 < (int)uVar18) {
          local_70 = -(ulong)uVar18;
          local_10c = (uint)CONCAT71((int7)((ulong)local_70 >> 8),1);
          local_78 = 0;
          lVar21 = 0;
          local_120 = (ulong)uVar18;
          do {
            while( true ) {
              lVar25 = lVar21 + 1;
              iVar24 = (local_118->m_ti).m_a[lVar21];
              local_68 = (local_140->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_a;
              uVar18 = local_68[iVar24].m_trim_index;
              lVar21 = lVar25;
              if (-1 < (int)uVar18) break;
LAB_004176ae:
              local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
              ON_SimpleArray<bool>::Append(&local_60,(bool *)local_138);
              local_10c = 0;
              if (local_70 + lVar25 == 0) {
                F = local_98;
                if ((local_78 & 1) == 0) goto LAB_00417727;
                goto LAB_0041776e;
              }
            }
            pOVar22 = local_68 + iVar24;
            pOVar10 = ON_BrepTrim::Loop(pOVar22);
            if (((pOVar10 == (ON_BrepLoop *)0x0) ||
                (pOVar11 = ON_BrepTrim::Brep(pOVar22), pOVar11 == (ON_Brep *)0x0)) ||
               ((pOVar12 = ON_BrepTrim::Edge(pOVar22), pOVar12 == (ON_BrepEdge *)0x0 ||
                ((pOVar12->m_edge_index < 0 || ((pOVar12->m_ti).m_count != 2))))))
            goto LAB_004176ae;
            puVar19 = (uint *)(pOVar12->m_ti).m_a;
            uVar8 = *puVar19;
            if (uVar8 == uVar18) {
              uVar8 = puVar19[1];
            }
            if ((int)uVar8 < 0) goto LAB_004176ae;
            pOVar27 = (pOVar11->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                      super_ON_ClassArray<ON_BrepTrim>.m_a;
            if (pOVar27[uVar8].m_trim_index < 0) goto LAB_004176ae;
            pOVar27 = pOVar27 + uVar8;
            pOVar13 = ON_BrepTrim::Loop(pOVar27);
            if ((pOVar13 != pOVar10) ||
               (pOVar14 = ON_BrepTrim::SurfaceOf(pOVar22), pOVar14 == (ON_Surface *)0x0))
            goto LAB_004176ae;
            (*(pOVar14->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pOVar14,0);
            local_d8 = ON_Interval::Length((ON_Interval *)local_138);
            local_d8 = local_d8 * 0.25;
            (*(pOVar14->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pOVar14,1);
            local_138._0_8_ = extraout_XMM0_Qa;
            local_138._8_8_ = in_XMM1_Qa;
            local_f0 = ON_Interval::Length((ON_Interval *)local_138);
            local_f0 = local_f0 * 0.25;
            bVar2 = pOVar22->m_bRev3d;
            bVar3 = pOVar27->m_bRev3d;
            ON_Curve::PointAtStart((ON_3dPoint *)local_138,(ON_Curve *)pOVar22);
            ON_2dPoint::ON_2dPoint((ON_2dPoint *)&local_108,(ON_3dPoint *)local_138);
            if (bVar2 == bVar3) {
              ON_Curve::PointAtStart((ON_3dPoint *)local_138,(ON_Curve *)pOVar27);
            }
            else {
              ON_Curve::PointAtEnd((ON_3dPoint *)local_138,(ON_Curve *)pOVar27);
            }
            ON_2dPoint::ON_2dPoint(&local_e8,(ON_3dPoint *)local_138);
            pdVar15 = ON_2dPoint::operator[]((ON_2dPoint *)&local_108,0);
            local_a8 = *pdVar15;
            uStack_a0 = 0;
            pdVar15 = ON_2dPoint::operator[](&local_e8,0);
            if (local_d8 < ABS(local_a8 - *pdVar15)) goto LAB_004176ae;
            pdVar15 = ON_2dPoint::operator[]((ON_2dPoint *)&local_108,1);
            local_a8 = *pdVar15;
            uStack_a0 = 0;
            pdVar15 = ON_2dPoint::operator[](&local_e8,1);
            if (local_f0 < ABS(local_a8 - *pdVar15)) goto LAB_004176ae;
            ON_Curve::PointAtEnd((ON_3dPoint *)local_138,(ON_Curve *)pOVar22);
            ON_2dPoint::operator=((ON_2dPoint *)&local_108,(ON_3dPoint *)local_138);
            if (bVar2 == bVar3) {
              ON_Curve::PointAtEnd((ON_3dPoint *)local_138,(ON_Curve *)pOVar27);
            }
            else {
              ON_Curve::PointAtStart((ON_3dPoint *)local_138,(ON_Curve *)pOVar27);
            }
            ON_2dPoint::operator=(&local_e8,(ON_3dPoint *)local_138);
            pdVar15 = ON_2dPoint::operator[]((ON_2dPoint *)&local_108,0);
            local_a8 = *pdVar15;
            uStack_a0 = 0;
            pdVar15 = ON_2dPoint::operator[](&local_e8,0);
            if (local_d8 < ABS(local_a8 - *pdVar15)) goto LAB_004176ae;
            pdVar15 = ON_2dPoint::operator[]((ON_2dPoint *)&local_108,1);
            local_d8 = *pdVar15;
            uStack_d0 = 0;
            pdVar15 = ON_2dPoint::operator[](&local_e8,1);
            if (local_f0 < ABS(local_d8 - *pdVar15)) goto LAB_004176ae;
            local_138[0] = 1;
            ON_SimpleArray<bool>::Append(&local_60,(bool *)local_138);
            ON_SimpleArray<int>::Append(&local_c0,&local_68[iVar24].m_trim_index);
            local_78 = CONCAT71((int7)((ulong)puVar19 >> 8),1);
          } while (local_70 + lVar25 != 0);
          F = local_98;
          if ((local_10c & 1) == 0) {
LAB_0041776e:
            F = local_98;
            local_138._0_8_ = local_88;
            local_138._8_8_ = (bool *)0x0;
            local_138._16_8_ = 0.0;
            ON_SimpleArray<bool>::operator=((ON_SimpleArray<bool> *)local_138,&local_60);
            local_108._vptr_ON_ClassArray = local_48;
            local_108.m_a = (ON_SimpleArray<int> *)0x0;
            local_108.m_count = 0;
            local_108.m_capacity = 0;
            iVar24 = 0;
LAB_004177bb:
            uVar20 = 0;
            do {
              if (*(bool *)(local_138._8_8_ + uVar20) == false) goto LAB_004177d2;
              uVar20 = uVar20 + 1;
            } while (local_120 != uVar20);
            if ((int)local_120 <= iVar24) goto LAB_00417af0;
            if (0 < local_108.m_count) {
              piVar5 = (local_118->m_ti).m_a;
              lVar21 = 0;
              do {
                if (0 < local_108.m_a[lVar21].m_count) {
                  piVar6 = local_108.m_a[lVar21].m_a;
                  lVar25 = 0;
                  do {
                    piVar6[lVar25] = piVar5[piVar6[lVar25]];
                    lVar25 = lVar25 + 1;
                  } while (lVar25 < local_108.m_a[lVar21].m_count);
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 < local_108.m_count);
            }
            TVar4 = local_118->m_type;
            if (0 < local_c0.m_count) {
              lVar21 = 0;
              do {
                iVar24 = local_c0.m_a[lVar21];
                pOVar22 = (local_140->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                          super_ON_ClassArray<ON_BrepTrim>.m_a;
                pOVar22[iVar24].m_li = -1;
                ON_Brep::DeleteTrim(local_140,pOVar22 + iVar24,true);
                lVar21 = lVar21 + 1;
              } while (lVar21 < local_c0.m_count);
            }
            if (-1 < (local_118->m_ti).m_capacity) {
              (local_118->m_ti).m_count = 0;
            }
            ON_Brep::DeleteLoop(local_140,local_118,true);
            bVar7 = true;
            if (0 < local_108.m_count) {
              lVar21 = 0;
              do {
                pOVar10 = ON_Brep::NewLoop(local_140,unknown,local_80);
                pOVar16 = local_108.m_a + lVar21;
                ON_SimpleArray<int>::operator=(&pOVar10->m_ti,pOVar16);
                iVar24 = pOVar16->m_count;
                if (0 < (long)iVar24) {
                  piVar5 = pOVar16->m_a;
                  pOVar22 = (local_140->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                            super_ON_ClassArray<ON_BrepTrim>.m_a;
                  iVar26 = pOVar10->m_loop_index;
                  lVar25 = 0;
                  do {
                    pOVar22[piVar5[lVar25]].m_li = iVar26;
                    lVar25 = lVar25 + 1;
                  } while (iVar24 != lVar25);
                }
                TVar9 = ON_Brep::ComputeLoopType(local_140,pOVar10);
                pOVar10->m_type = TVar9;
                if (TVar9 == outer && TVar4 == outer) {
                  piVar5 = (local_80->m_li).m_a;
                  iVar24 = *piVar5;
                  iVar26 = pOVar10->m_loop_index;
                  *piVar5 = iVar26;
                  uVar20 = (ulong)(uint)(local_80->m_li).m_count;
                  do {
                    if ((int)uVar20 < 2) goto LAB_00417abc;
                    uVar1 = uVar20 - 1;
                    lVar25 = uVar20 - 1;
                    uVar20 = uVar1;
                  } while (piVar5[lVar25] != iVar26);
                  piVar5[uVar1] = iVar24;
                }
LAB_00417abc:
                ON_Brep::MatchTrimEnds(local_140,pOVar10);
                (*(local_140->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])
                          (local_140,pOVar10,1);
                lVar21 = lVar21 + 1;
                if (local_108.m_count <= lVar21) break;
              } while( true );
            }
            goto LAB_00417af0;
          }
        }
      }
    }
    bVar7 = true;
    ON_Brep::DeleteLoop(local_140,local_118,true);
    goto LAB_00417727;
  }
  goto LAB_00417749;
LAB_004177d2:
  local_e8.x._0_4_ = (int)uVar20;
  pOVar16 = ON_ClassArray<ON_SimpleArray<int>_>::AppendNew(&local_108);
  ON_SimpleArray<int>::Append(pOVar16,(int *)&local_e8);
  local_d8 = (double)CONCAT44(local_d8._4_4_,iVar24 + 1);
  *(bool *)(local_138._8_8_ + (long)local_e8.x._0_4_) = true;
  uVar20 = (long)(local_e8.x._0_4_ + 1) % (long)(int)local_120;
  local_144 = (int)uVar20;
  uVar20 = uVar20 & 0xffffffff;
  uVar18 = 0;
  do {
    pOVar10 = local_118;
    iVar24 = (int)uVar20;
    if (*(bool *)(local_138._8_8_ + (long)iVar24) == false) {
      ON_SimpleArray<int>::Append(pOVar16,&local_144);
      *(bool *)(local_138._8_8_ + (long)local_144) = true;
      uVar20 = (long)(local_144 + 1) % (long)(int)local_120;
      local_144 = (int)uVar20;
      uVar20 = uVar20 & 0xffffffff;
      uVar18 = uVar18 + 1;
    }
    else {
      if (iVar24 == local_e8.x._0_4_) break;
      if (local_60.m_a[iVar24] == true) {
        pOVar22 = (local_140->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                  super_ON_ClassArray<ON_BrepTrim>.m_a + (local_118->m_ti).m_a[iVar24];
        pOVar12 = ON_BrepTrim::Edge(pOVar22);
        piVar5 = (pOVar12->m_ti).m_a;
        local_144 = -1;
        iVar26 = ~uVar18 + iVar24;
        uVar20 = 0;
        while ((pOVar10->m_ti).m_a[uVar20] != piVar5[*piVar5 == pOVar22->m_trim_index]) {
          uVar20 = uVar20 + 1;
          iVar26 = iVar26 + -1;
          if (local_120 == uVar20) goto LAB_00417af0;
        }
        iVar17 = (int)local_120;
        if (iVar24 < (int)uVar20) {
          iVar17 = 0;
        }
        uVar20 = (long)((int)uVar20 + 1) % (long)(int)local_120;
        local_144 = (int)uVar20;
        uVar20 = uVar20 & 0xffffffff;
        uVar18 = iVar17 - iVar26;
      }
    }
    if ((int)local_120 <= (int)uVar18) goto LAB_00417af0;
  } while( true );
  iVar24 = local_d8._0_4_;
  if (local_d8._0_4_ == (int)local_120) goto LAB_00417af0;
  goto LAB_004177bb;
LAB_00417af0:
  ON_ClassArray<ON_SimpleArray<int>_>::~ON_ClassArray(&local_108);
  ON_SimpleArray<bool>::~ON_SimpleArray((ON_SimpleArray<bool> *)local_138);
LAB_00417727:
  ON_SimpleArray<int>::~ON_SimpleArray(&local_c0);
  ON_SimpleArray<bool>::~ON_SimpleArray(&local_60);
LAB_00417749:
  local_c8 = local_c8 + 1;
  if (local_c8 == local_40) {
    return bVar7;
  }
  goto LAB_0041721b;
}

Assistant:

bool ON_BrepRemoveSlits(ON_BrepFace& F)

{
  //For each loop, look for slit pairs that fall between non slits and 
  //break the loop at the pair.
  //After all loops have been split, call ON_Brep::RemoveSlits() on the result.

  if (F.m_face_index < 0)
    return false;
  ON_Brep* pB = F.Brep();
  if (!pB)
    return false;
  bool rc = false;
  int loop_count = F.m_li.Count();
  int i;
  for (i=0; i<loop_count; i++){
    ON_BrepLoop& L = pB->m_L[F.m_li[i]];
    if (L.m_loop_index < 0)
      continue;
    if (ON_BrepRemoveSlits(L))
      rc = true;
  }
  return rc;
}